

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O0

void __thiscall QSimplexConstraint::invert(QSimplexConstraint *this)

{
  long lVar1;
  bool bVar2;
  double *pdVar3;
  iterator *in_RDI;
  long in_FS_OFFSET;
  iterator iter;
  iterator *in_stack_ffffffffffffffc0;
  iterator *this_00;
  QHash<QSimplexVariable_*,_double> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->i).bucket = (in_RDI->i).bucket ^ 0x8000000000000000;
  *(int *)&in_RDI[1].i.d = 2 - *(int *)&in_RDI[1].i.d;
  this_00 = in_RDI;
  QHash<QSimplexVariable_*,_double>::begin(in_stack_ffffffffffffffd8);
  while( true ) {
    QHash<QSimplexVariable_*,_double>::end((QHash<QSimplexVariable_*,_double> *)in_RDI);
    bVar2 = QHash<QSimplexVariable_*,_double>::iterator::operator!=
                      (in_RDI,in_stack_ffffffffffffffc0);
    if (!bVar2) break;
    pdVar3 = QHash<QSimplexVariable_*,_double>::iterator::value((iterator *)0xa5dbab);
    in_stack_ffffffffffffffc0 = (iterator *)((ulong)*pdVar3 ^ 0x8000000000000000);
    pdVar3 = QHash<QSimplexVariable_*,_double>::iterator::value((iterator *)0xa5dbd6);
    *pdVar3 = (double)in_stack_ffffffffffffffc0;
    QHash<QSimplexVariable_*,_double>::iterator::operator++(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSimplexConstraint::invert()
{
    constant = -constant;
    ratio = Ratio(2 - ratio);

    for (auto iter = variables.begin(); iter != variables.end(); ++iter)
        iter.value() = -iter.value();
}